

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedNumber *FN)

{
  size_t __n;
  uint uVar1;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  SmallString<16U> Buffer;
  raw_svector_ostream Stream;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  raw_ostream local_58;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&local_78;
  if (FN->Hex == true) {
    uVar1 = (uint)FN->HexPrefix * 2;
    if (FN->Upper == false) {
      uVar1 = (uint)FN->HexPrefix * 2 + 1;
    }
    Width.Storage._8_8_ = in_R9;
    Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer = (AlignedCharArray<8UL,_8UL>)0x1;
    llvm::write_hex((llvm *)this,(raw_ostream *)FN->HexValue,(ulong)uVar1,FN->Width,Width);
  }
  else {
    local_70 = 0x1000000000;
    local_58.BufferMode = InternalBuffer;
    local_58.OutBufStart = (char *)0x0;
    local_58.OutBufEnd = (char *)0x0;
    local_58.OutBufCur = (char *)0x0;
    local_58._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00184548;
    local_78 = local_68;
    SetUnbuffered(&local_58);
    __n = 0;
    write_integer(&local_58,FN->DecValue,0,Integer);
    uVar1 = FN->Width - (uint)local_70;
    if ((uint)local_70 <= FN->Width && uVar1 != 0) {
      indent(this,uVar1);
    }
    write(this,(int)local_78,(void *)(ulong)(uint)local_70,__n);
    ~raw_ostream(&local_58);
    if (local_78 != local_68) {
      free(local_78);
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedNumber &FN) {
  if (FN.Hex) {
    HexPrintStyle Style;
    if (FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixUpper;
    else if (FN.Upper && !FN.HexPrefix)
      Style = HexPrintStyle::Upper;
    else if (!FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixLower;
    else
      Style = HexPrintStyle::Lower;
    llvm::write_hex(*this, FN.HexValue, Style, FN.Width);
  } else {
    llvm::SmallString<16> Buffer;
    llvm::raw_svector_ostream Stream(Buffer);
    llvm::write_integer(Stream, FN.DecValue, 0, IntegerStyle::Integer);
    if (Buffer.size() < FN.Width)
      indent(FN.Width - Buffer.size());
    (*this) << Buffer;
  }
  return *this;
}